

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O3

void poly_short_sample_plus(poly *out,uint8_t *in)

{
  uint16_t *puVar1;
  short sVar2;
  long lVar3;
  ulong uVar4;
  uint16_t uVar5;
  
  poly_short_sample(out,in);
  lVar3 = 1;
  sVar2 = 0;
  uVar5 = (out->field_0).v[0];
  do {
    puVar1 = (out->field_0).v + lVar3;
    sVar2 = sVar2 + uVar5 * *puVar1;
    lVar3 = lVar3 + 1;
    uVar5 = *puVar1;
  } while (lVar3 != 700);
  uVar4 = 0xfffffffffffffffe;
  do {
    *(ushort *)((long)&out->field_0 + uVar4 * 2 + 4) =
         *(short *)((long)&out->field_0 + uVar4 * 2 + 4) * (sVar2 >> 0xf | 1U);
    uVar4 = uVar4 + 2;
  } while (uVar4 < 699);
  poly_assert_normalized(out);
  return;
}

Assistant:

static void poly_short_sample_plus(struct poly *out,
                                   const uint8_t in[HRSS_SAMPLE_BYTES]) {
  poly_short_sample(out, in);

  // sum (and the product in the for loop) will overflow. But that's fine
  // because |sum| is bound by +/- (N-2), and N < 2^15 so it works out.
  uint16_t sum = 0;
  for (unsigned i = 0; i < N - 2; i++) {
    sum += (unsigned)out->v[i] * out->v[i + 1];
  }

  // If the sum is negative, flip the sign of even-positioned coefficients. (See
  // page 8 of [HRSS].)
  sum = ((int16_t)sum) >> 15;
  const uint16_t scale = sum | (~sum & 1);
  for (unsigned i = 0; i < N; i += 2) {
    out->v[i] = (unsigned)out->v[i] * scale;
  }
  poly_assert_normalized(out);
}